

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

void __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ImplicitProducer::~ImplicitProducer(ImplicitProducer *this)

{
  FreeList<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
  *pFVar1;
  int *piVar2;
  atomic<unsigned_int> *paVar3;
  __int_type_conflict3 _Var4;
  ulong uVar5;
  ulong uVar6;
  ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
  *pCVar7;
  __pointer_type pBVar8;
  __int_type _Var9;
  long *plVar10;
  Block *pBVar11;
  BlockIndexHeader *pBVar12;
  int iVar13;
  __pointer_type pBVar14;
  __pointer_type pBVar15;
  long lVar16;
  __pointer_type pBVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ImplicitProducer_0244b410;
  uVar5 = (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  uVar6 = (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i;
  if (uVar6 != uVar5) {
    pBVar17 = (__pointer_type)0x0;
    uVar19 = uVar6;
    do {
      if (pBVar17 == (__pointer_type)0x0 || (uVar19 & 0x1f) == 0) {
        if (pBVar17 != (__pointer_type)0x0) {
          pCVar7 = (this->super_ProducerBase).parent;
          LOCK();
          paVar3 = &pBVar17->freeListRefs;
          _Var4 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
          (paVar3->super___atomic_base<unsigned_int>)._M_i =
               (paVar3->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
          UNLOCK();
          if (_Var4 == 0) {
            pBVar14 = (pCVar7->freeList).freeListHead._M_b._M_p;
            do {
              (pBVar17->freeListNext)._M_b._M_p = pBVar14;
              (pBVar17->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
              pFVar1 = &pCVar7->freeList;
              LOCK();
              pBVar15 = (pFVar1->freeListHead)._M_b._M_p;
              bVar20 = pBVar14 == pBVar15;
              if (bVar20) {
                (pFVar1->freeListHead)._M_b._M_p = pBVar17;
                pBVar15 = pBVar14;
              }
              UNLOCK();
              if (bVar20) break;
              LOCK();
              paVar3 = &pBVar17->freeListRefs;
              _Var4 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
              (paVar3->super___atomic_base<unsigned_int>)._M_i =
                   (paVar3->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
              UNLOCK();
              pBVar14 = pBVar15;
            } while (_Var4 == 1);
          }
        }
        pBVar8 = (this->blockIndex)._M_b._M_p;
        _Var9 = (pBVar8->tail).super___atomic_base<unsigned_long>._M_i;
        lVar16 = (uVar19 & 0xffffffffffffffe0) -
                 (pBVar8->index[_Var9]->key).super___atomic_base<unsigned_long>._M_i;
        lVar18 = lVar16 + 0x1f;
        if (-1 < lVar16) {
          lVar18 = lVar16;
        }
        pBVar17 = (pBVar8->index[pBVar8->capacity - 1 & (lVar18 >> 5) + _Var9]->value)._M_b._M_p;
      }
      plVar10 = *(long **)(pBVar17->elements + (uVar19 & 0x1f) * 0x18 + 8);
      if (plVar10 != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)((long)plVar10 + 0xc);
          iVar13 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
        }
        else {
          iVar13 = *(int *)((long)plVar10 + 0xc);
          *(int *)((long)plVar10 + 0xc) = iVar13 + -1;
        }
        if (iVar13 == 1) {
          (**(code **)(*plVar10 + 0x18))();
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar5);
  }
  pBVar11 = (this->super_ProducerBase).tailBlock;
  if ((pBVar11 != (Block *)0x0) && ((uVar5 & 0x1f) != 0 || uVar6 != uVar5)) {
    pCVar7 = (this->super_ProducerBase).parent;
    LOCK();
    paVar3 = &pBVar11->freeListRefs;
    _Var4 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
    (paVar3->super___atomic_base<unsigned_int>)._M_i =
         (paVar3->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
    UNLOCK();
    if (_Var4 == 0) {
      pBVar17 = (pCVar7->freeList).freeListHead._M_b._M_p;
      do {
        (pBVar11->freeListNext)._M_b._M_p = pBVar17;
        (pBVar11->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
        pFVar1 = &pCVar7->freeList;
        LOCK();
        pBVar14 = (pFVar1->freeListHead)._M_b._M_p;
        bVar20 = pBVar17 == pBVar14;
        if (bVar20) {
          (pFVar1->freeListHead)._M_b._M_p = pBVar11;
          pBVar14 = pBVar17;
        }
        UNLOCK();
        if (bVar20) break;
        LOCK();
        paVar3 = &pBVar11->freeListRefs;
        _Var4 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        (paVar3->super___atomic_base<unsigned_int>)._M_i =
             (paVar3->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
        UNLOCK();
        pBVar17 = pBVar14;
      } while (_Var4 == 1);
    }
  }
  pBVar8 = (this->blockIndex)._M_b._M_p;
  while (pBVar8 != (__pointer_type)0x0) {
    pBVar12 = pBVar8->prev;
    free(pBVar8);
    pBVar8 = pBVar12;
  }
  return;
}

Assistant:

~ImplicitProducer()
		{
			// Note that since we're in the destructor we can assume that all enqueue/dequeue operations
			// completed already; this means that all undequeued elements are placed contiguously across
			// contiguous blocks, and that only the first and last remaining blocks can be only partially
			// empty (all other remaining blocks must be completely full).
			
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
			// Unregister ourselves for thread termination notification
			if (!this->inactive.load(std::memory_order_relaxed)) {
				details::ThreadExitNotifier::unsubscribe(&threadExitListener);
			}
#endif
			
			// Destroy all remaining elements!
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto index = this->headIndex.load(std::memory_order_relaxed);
			Block* block = nullptr;
			assert(index == tail || details::circular_less_than(index, tail));
			bool forceFreeLastBlock = index != tail;		// If we enter the loop, then the last (tail) block will not be freed
			while (index != tail) {
				if ((index & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 || block == nullptr) {
					if (block != nullptr) {
						// Free the old block
						this->parent->add_block_to_free_list(block);
					}
					
					block = get_block_index_entry_for_index(index)->value.load(std::memory_order_relaxed);
				}
				
				((*block)[index])->~T();
				++index;
			}
			// Even if the queue is empty, there's still one block that's not on the free list
			// (unless the head index reached the end of it, in which case the tail will be poised
			// to create a new block).
			if (this->tailBlock != nullptr && (forceFreeLastBlock || (tail & static_cast<index_t>(BLOCK_SIZE - 1)) != 0)) {
				this->parent->add_block_to_free_list(this->tailBlock);
			}
			
			// Destroy block index
			auto localBlockIndex = blockIndex.load(std::memory_order_relaxed);
			if (localBlockIndex != nullptr) {
				for (size_t i = 0; i != localBlockIndex->capacity; ++i) {
					localBlockIndex->index[i]->~BlockIndexEntry();
				}
				do {
					auto prev = localBlockIndex->prev;
					localBlockIndex->~BlockIndexHeader();
					(Traits::free)(localBlockIndex);
					localBlockIndex = prev;
				} while (localBlockIndex != nullptr);
			}
		}